

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O0

ostream * cppcms::json::operator<<(ostream *out,json_type t)

{
  undefined4 in_ESI;
  ostream *in_RDI;
  
  switch(in_ESI) {
  case 0:
    std::operator<<(in_RDI,"undefined");
    break;
  case 1:
    std::operator<<(in_RDI,"null");
    break;
  case 2:
    std::operator<<(in_RDI,"boolean");
    break;
  case 3:
    std::operator<<(in_RDI,"number");
    break;
  case 4:
    std::operator<<(in_RDI,"string");
    break;
  case 5:
    std::operator<<(in_RDI,"object");
    break;
  case 6:
    std::operator<<(in_RDI,"array");
    break;
  default:
    std::operator<<(in_RDI,"Illegal");
  }
  return in_RDI;
}

Assistant:

std::ostream &operator<<(std::ostream &out,json_type t)
	{
		switch(t) {
		case is_undefined: out<<"undefined"; break;
		case is_null: out<<"null"; break;
		case is_boolean: out<<"boolean"; break;
		case is_number: out<<"number"; break;
		case is_string: out<<"string"; break;
		case is_object: out<<"object"; break;
		case is_array: out<<"array"; break;
		default:
			out<<"Illegal";
		}
		return out;
	}